

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

DWARFDie __thiscall
llvm::DWARFDie::getAttributeValueAsReferencedDie(DWARFDie *this,DWARFFormValue *V)

{
  DWARFDie DVar1;
  undefined1 local_30 [8];
  Optional<llvm::DWARFFormValue::UnitOffset> SpecRef;
  
  DWARFFormValue::getAsRelativeReference((Optional<llvm::DWARFFormValue::UnitOffset> *)local_30,V);
  if (SpecRef.Storage.field_0.value.Offset._0_1_ == '\x01') {
    if (local_30 == (undefined1  [8])0x0) {
      local_30 = (undefined1  [8])
                 DWARFUnitVector::getUnitForOffset
                           (this->U->UnitVector,(uint64_t)SpecRef.Storage.field_0.value.Unit);
      if (local_30 == (undefined1  [8])0x0) goto LAB_00d6d1c8;
      if (SpecRef.Storage.field_0.value.Offset._0_1_ == '\0') {
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xad,
                      "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset>::getValue() & [T = llvm::DWARFFormValue::UnitOffset]"
                     );
      }
    }
    else {
      SpecRef.Storage.field_0.value.Unit =
           (DWARFUnit *)
           ((long)&(SpecRef.Storage.field_0.value.Unit)->_vptr_DWARFUnit +
           ((DWARFUnitHeader *)((long)local_30 + 0x18))->Offset);
    }
    DVar1 = DWARFUnit::getDIEForOffset
                      ((DWARFUnit *)local_30,(uint64_t)SpecRef.Storage.field_0.value.Unit);
  }
  else {
LAB_00d6d1c8:
    DVar1 = (DWARFDie)ZEXT816(0);
  }
  return DVar1;
}

Assistant:

DWARFDie
DWARFDie::getAttributeValueAsReferencedDie(const DWARFFormValue &V) const {
  if (auto SpecRef = V.getAsRelativeReference()) {
    if (SpecRef->Unit)
      return SpecRef->Unit->getDIEForOffset(SpecRef->Unit->getOffset() + SpecRef->Offset);
    if (auto SpecUnit = U->getUnitVector().getUnitForOffset(SpecRef->Offset))
      return SpecUnit->getDIEForOffset(SpecRef->Offset);
  }
  return DWARFDie();
}